

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  long *plVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  double dVar16;
  double dVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  
  if (this->gradient_norm_scratch == (float *)0x0) {
    pfVar7 = (float *)cnn_mm_malloc((long)(this->all_params).
                                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->all_params).
                                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 1,0x100);
    this->gradient_norm_scratch = pfVar7;
  }
  ppPVar1 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar1 == ppPVar2) {
    uVar9 = 0;
  }
  else {
    lVar10 = 0;
    uVar9 = 0;
    lVar11 = 0;
    do {
      plVar3 = *(long **)((long)ppPVar1 + lVar11 * 2);
      (**(code **)(*plVar3 + 0x10))(plVar3,(long)this->gradient_norm_scratch + lVar11);
      lVar11 = lVar11 + 4;
      uVar9 = uVar9 + 1;
      lVar6 = lVar10 + 8;
      lVar10 = lVar10 + 8;
    } while ((pointer)((long)ppPVar1 + lVar6) != ppPVar2);
  }
  if (uVar9 == 0) {
    auVar17 = ZEXT816(0);
  }
  else {
    auVar13 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = ZEXT1664(ZEXT816(0));
    do {
      auVar18 = auVar15;
      auVar15 = vpbroadcastq_avx512f();
      auVar15 = vporq_avx512f(auVar15,auVar14);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar13,2);
      pfVar7 = this->gradient_norm_scratch + uVar8;
      auVar12._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * (int)pfVar7[1];
      auVar12._0_4_ = (uint)((byte)uVar5 & 1) * (int)*pfVar7;
      auVar12._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * (int)pfVar7[2];
      auVar12._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * (int)pfVar7[3];
      auVar12._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * (int)pfVar7[4];
      auVar12._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * (int)pfVar7[5];
      auVar12._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * (int)pfVar7[6];
      auVar12._28_4_ = (uint)(byte)(uVar5 >> 7) * (int)pfVar7[7];
      auVar15 = vcvtps2pd_avx512f(auVar12);
      auVar15 = vaddpd_avx512f(auVar18,auVar15);
      uVar8 = uVar8 + 8;
    } while (((ulong)uVar9 + 7 & 0xfffffffffffffff8) != uVar8);
    bVar4 = (bool)((byte)uVar5 & 1);
    auVar13._0_8_ = (ulong)bVar4 * auVar15._0_8_ | (ulong)!bVar4 * auVar18._0_8_;
    bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar13._8_8_ = (ulong)bVar4 * auVar15._8_8_ | (ulong)!bVar4 * auVar18._8_8_;
    bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar13._16_8_ = (ulong)bVar4 * auVar15._16_8_ | (ulong)!bVar4 * auVar18._16_8_;
    bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar13._24_8_ = (ulong)bVar4 * auVar15._24_8_ | (ulong)!bVar4 * auVar18._24_8_;
    bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar13._32_8_ = (ulong)bVar4 * auVar15._32_8_ | (ulong)!bVar4 * auVar18._32_8_;
    bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar13._40_8_ = (ulong)bVar4 * auVar15._40_8_ | (ulong)!bVar4 * auVar18._40_8_;
    bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar13._48_8_ = (ulong)bVar4 * auVar15._48_8_ | (ulong)!bVar4 * auVar18._48_8_;
    auVar13._56_8_ = (uVar5 >> 7) * auVar15._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar18._56_8_;
    auVar12 = vextractf64x4_avx512f(auVar13,1);
    auVar15 = vaddpd_avx512f(auVar13,ZEXT3264(auVar12));
    dVar16 = auVar15._0_8_ + auVar15._16_8_;
    dVar19 = auVar15._8_8_ + auVar15._24_8_;
    auVar17._0_8_ = dVar16 + dVar19;
    auVar17._8_8_ = dVar16 + dVar19;
  }
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  return (float)auVar17._0_8_;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}